

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetStatistics
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_STATISTICS *registryStatistics)

{
  LOGGER_LOG p_Var1;
  BUFFER_HANDLE responseBuffer_00;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  BUFFER_HANDLE responseBuffer;
  LOGGER_LOG l;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  IOTHUB_REGISTRY_STATISTICS *registryStatistics_local;
  IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle_local;
  
  if ((registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
     (registryStatistics == (IOTHUB_REGISTRY_STATISTICS *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"IoTHubRegistryManager_GetStatistics",0x74b,1,"Input parameter cannot be NULL");
    }
    l._4_4_ = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
  }
  else {
    responseBuffer_00 = BUFFER_new();
    if (responseBuffer_00 == (BUFFER_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"IoTHubRegistryManager_GetStatistics",0x754,1,
                  "BUFFER_new failed for responseBuffer");
      }
      l._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else {
      l._4_4_ = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_GET_STATISTICS,(char *)0x0,
                                    (char *)0x0,(BUFFER_HANDLE)0x0,0,responseBuffer_00);
      if (l._4_4_ == IOTHUB_REGISTRYMANAGER_ERROR) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"IoTHubRegistryManager_GetStatistics",0x759,1,
                    "Failure sending HTTP request for get registry statistics");
        }
      }
      else if (l._4_4_ == IOTHUB_REGISTRYMANAGER_OK) {
        l._4_4_ = parseStatisticsJson(responseBuffer_00,registryStatistics);
      }
    }
    if (responseBuffer_00 != (BUFFER_HANDLE)0x0) {
      BUFFER_delete(responseBuffer_00);
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetStatistics(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REGISTRY_STATISTICS* registryStatistics)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (registryStatistics == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else
    {
        BUFFER_HANDLE responseBuffer;

        if ((responseBuffer = BUFFER_new()) == NULL)
        {
            LogError("BUFFER_new failed for responseBuffer");
            result = IOTHUB_REGISTRYMANAGER_ERROR;
        }
        else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_GET_STATISTICS, NULL, NULL, NULL, 0, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
        {
            LogError("Failure sending HTTP request for get registry statistics");
        }
        else if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            result = parseStatisticsJson(responseBuffer, registryStatistics);
        }

        if (responseBuffer != NULL)
        {
            BUFFER_delete(responseBuffer);
        }
    }
    return result;
}